

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_format_bitcoin_message
              (uchar *bytes,size_t bytes_len,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  size_t sVar1;
  ulong size;
  bool bVar2;
  ulong local_170;
  size_t msg_len;
  uchar *puStack_158;
  _Bool do_hash;
  uchar *out;
  uchar *msg_buf;
  uchar buf [256];
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  bVar2 = (flags & 1) != 0;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((((bytes == (uchar *)0x0) || (bytes_len == 0)) || (0xffc0 < bytes_len)) ||
      (((flags & 0xfffffffe) != 0 || (bytes_out == (uchar *)0x0)))) || (written == (size_t *)0x0)) {
    bytes_local._4_4_ = -2;
  }
  else {
    sVar1 = varint_len(bytes_len);
    size = sVar1 + 0x19 + bytes_len;
    local_170 = size;
    if (bVar2) {
      local_170 = 0x20;
    }
    *written = local_170;
    if (len < *written) {
      bytes_local._4_4_ = 0;
    }
    else {
      out = bytes_out;
      if (((bVar2) && (out = (uchar *)&msg_buf, 0x100 < size)) &&
         (out = (uchar *)wally_malloc(size), out == (uchar *)0x0)) {
        *written = 0;
        bytes_local._4_4_ = -3;
      }
      else {
        builtin_memcpy(out,"\x18Bitcoin Signed Message:\n",0x19);
        if (bytes_len < 0xfd) {
          puStack_158 = out + 0x1a;
          out[0x19] = (uchar)bytes_len;
        }
        else {
          out[0x19] = 0xfd;
          out[0x1a] = (uchar)bytes_len;
          puStack_158 = out + 0x1c;
          out[0x1b] = (uchar)(bytes_len >> 8);
        }
        memcpy(puStack_158,bytes,bytes_len);
        if (bVar2) {
          wally_sha256d(out,size,bytes_out,0x20);
          wally_clear(out,size);
          if ((uchar **)out != &msg_buf) {
            wally_free(out);
          }
        }
        bytes_local._4_4_ = 0;
      }
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_format_bitcoin_message(const unsigned char *bytes, size_t bytes_len,
                                 uint32_t flags,
                                 unsigned char *bytes_out, size_t len,
                                 size_t *written)
{
    unsigned char buf[256], *msg_buf = bytes_out, *out;
    const bool do_hash = (flags & BITCOIN_MESSAGE_FLAG_HASH);
    size_t msg_len;

    if (written)
        *written = 0;

    if (!bytes || !bytes_len || bytes_len > BITCOIN_MESSAGE_MAX_LEN ||
        (flags & ~MSG_ALL_FLAGS) || !bytes_out || !written)
        return WALLY_EINVAL;

    msg_len = sizeof(MSG_PREFIX) - 1 + varint_len(bytes_len) + bytes_len;
    *written = do_hash ? SHA256_LEN : msg_len;

    if (len < *written)
        return WALLY_OK; /* Not enough output space, return required size */

    if (do_hash) {
        /* Ensure we have a suitable temporary buffer to serialize into */
        msg_buf = buf;
        if (msg_len > sizeof(buf)) {
            msg_buf = wally_malloc(msg_len);
            if (!msg_buf) {
                *written = 0;
                return WALLY_ENOMEM;
            }
        }
    }

    /* Serialize the message */
    out = msg_buf;
    memcpy(out, MSG_PREFIX, sizeof(MSG_PREFIX) - 1);
    out += sizeof(MSG_PREFIX) - 1;
    if (bytes_len < 0xfd)
        *out++ = bytes_len;
    else {
        *out++ = 0xfd;
        *out++ = bytes_len & 0xff;
        *out++ = bytes_len >> 8;
    }
    memcpy(out, bytes, bytes_len);

    if (do_hash) {
        wally_sha256d(msg_buf, msg_len, bytes_out, SHA256_LEN);
        wally_clear(msg_buf, msg_len);
        if (msg_buf != buf)
            wally_free(msg_buf);
    }
    return WALLY_OK;
}